

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O2

void __thiscall ctemplate::TemplateCache::RefcountedTemplate::IncRef(RefcountedTemplate *this)

{
  Mutex::Lock(&this->mutex_);
  if (0 < this->refcount_) {
    this->refcount_ = this->refcount_ + 1;
    Mutex::Unlock(&this->mutex_);
    return;
  }
  __assert_fail("refcount_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                ,0x5f,"void ctemplate::TemplateCache::RefcountedTemplate::IncRef()");
}

Assistant:

void IncRef() {
    MutexLock ml(&mutex_);
    assert(refcount_ > 0);
    ++refcount_;
  }